

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

HighsTripletTreeSlicePreOrder * __thiscall
presolve::HPresolve::getRowVector
          (HighsTripletTreeSlicePreOrder *__return_storage_ptr__,HPresolve *this,HighsInt row)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  
  pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSlicePreOrder>).nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSlicePreOrder>).nodeValue = pdVar2
  ;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSlicePreOrder>).nodeLeft = piVar3;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSlicePreOrder>).nodeRight = piVar4
  ;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSlicePreOrder>).root = iVar1;
  return __return_storage_ptr__;
}

Assistant:

HighsTripletTreeSlicePreOrder HPresolve::getRowVector(HighsInt row) const {
  return HighsTripletTreeSlicePreOrder(
      Acol.data(), Avalue.data(), ARleft.data(), ARright.data(), rowroot[row]);
}